

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O1

int inflate_gzip_block(BGZF *fp,int cached)

{
  uInt uVar1;
  void *__dest;
  hFILE *fp_00;
  z_stream *pzVar2;
  int iVar3;
  size_t __n;
  ulong uVar4;
  bool bVar5;
  
  bVar5 = cached == 0;
  do {
    if ((bVar5) && (fp->gz_stream->avail_out != 0)) {
      __dest = fp->compressed_block;
      fp_00 = fp->fp;
      uVar4 = (long)fp_00->end - (long)fp_00->begin;
      __n = 0xff00;
      if (uVar4 < 0xff00) {
        __n = uVar4;
      }
      memcpy(__dest,fp_00->begin,__n);
      fp_00->begin = fp_00->begin + __n;
      if (uVar4 < 0xff00) {
        __n = hread2(fp_00,__dest,0xff00,__n);
      }
      pzVar2 = fp->gz_stream;
      pzVar2->avail_in = (uInt)__n;
      if ((uInt)__n == 0) {
        return 0;
      }
      pzVar2->next_in = (Bytef *)fp->compressed_block;
    }
    do {
      iVar3 = fp->block_offset;
      pzVar2 = fp->gz_stream;
      pzVar2->next_out = (Bytef *)((long)iVar3 + (long)fp->uncompressed_block);
      pzVar2->avail_out = 0x10000 - iVar3;
      iVar3 = inflate(pzVar2,0);
      if (iVar3 != -5) {
        if (iVar3 < 0) {
          return -1;
        }
        uVar1 = fp->gz_stream->avail_out;
        if (uVar1 != 0x10000) {
          return -(uVar1 - 0x10000);
        }
      }
      uVar1 = fp->gz_stream->avail_out;
    } while (uVar1 == 0);
    bVar5 = true;
    if (iVar3 == 1) {
      return 0x10000 - uVar1;
    }
  } while( true );
}

Assistant:

static int inflate_gzip_block(BGZF *fp, int cached)
{
    int ret = Z_OK;
    do
    {
        if ( !cached && fp->gz_stream->avail_out!=0 )
        {
            fp->gz_stream->avail_in = hread(fp->fp, fp->compressed_block, BGZF_BLOCK_SIZE);
            if ( fp->gz_stream->avail_in<=0 ) return fp->gz_stream->avail_in;
            if ( fp->gz_stream->avail_in==0 ) break;
            fp->gz_stream->next_in = fp->compressed_block;
        }
        else cached = 0;
        do
        {
            fp->gz_stream->next_out = (Bytef*)fp->uncompressed_block + fp->block_offset;
            fp->gz_stream->avail_out = BGZF_MAX_BLOCK_SIZE - fp->block_offset;
            ret = inflate(fp->gz_stream, Z_NO_FLUSH);
            if ( ret==Z_BUF_ERROR ) continue;   // non-critical error
            if ( ret<0 ) return -1;
            unsigned int have = BGZF_MAX_BLOCK_SIZE - fp->gz_stream->avail_out;
            if ( have ) return have;
        }
        while ( fp->gz_stream->avail_out == 0 );
    }
    while (ret != Z_STREAM_END);
    return BGZF_MAX_BLOCK_SIZE - fp->gz_stream->avail_out;
}